

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_uniform(Context *ctx,RegisterType regtype,int regnum,VariableList *var)

{
  int base;
  char *buf;
  uint uVar1;
  size_t in_R8;
  ulong uVar2;
  char name [64];
  char varname [64];
  char acStack_a8 [64];
  char local_68 [64];
  
  buf = local_68;
  get_GLSL_varname_in_buf(ctx,regtype,regnum,buf,in_R8);
  push_output(ctx,&ctx->globals);
  if (var == (VariableList *)0x0) {
    get_GLSL_uniform_array_varname(ctx,regtype,acStack_a8,(size_t)buf);
    if (regtype == REG_TYPE_CONSTBOOL) {
      uVar2 = (ulong)(uint)ctx->uniform_bool_count;
    }
    else if (regtype == REG_TYPE_CONSTINT) {
      uVar2 = (ulong)(uint)ctx->uniform_int4_count;
    }
    else if (regtype == REG_TYPE_CONST) {
      uVar2 = (ulong)(uint)ctx->uniform_float4_count;
    }
    else {
      uVar2 = 0;
      if (ctx->isfail == 0) {
        __assert_fail("isfail(ctx)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x9ab,
                      "void emit_GLSL_uniform(Context *, RegisterType, int, const VariableList *)");
      }
    }
  }
  else {
    base = var->index;
    if (var->constant == (ConstantsList *)0x0) {
      if (var->emit_position == -1) {
        __assert_fail("var->emit_position != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x9bb,
                      "void emit_GLSL_uniform(Context *, RegisterType, int, const VariableList *)");
      }
      get_GLSL_uniform_array_varname(ctx,regtype,acStack_a8,(size_t)buf);
      uVar1 = (regnum - base) + var->emit_position;
    }
    else {
      get_GLSL_const_array_varname_in_buf(ctx,base,var->count,acStack_a8,in_R8);
      uVar1 = regnum - base;
    }
    uVar2 = (ulong)uVar1;
  }
  output_line(ctx,"#define %s %s[%d]",local_68,acStack_a8,uVar2);
  pop_output(ctx);
  return;
}

Assistant:

static void emit_GLSL_uniform(Context *ctx, RegisterType regtype, int regnum,
                              const VariableList *var)
{
    // Now that we're pushing all the uniforms as one big array, pack these
    //  down, so if we only use register c439, it'll actually map to
    //  glsl_uniforms_vec4[0]. As we push one big array, this will prevent
    //  uploading unused data.

    char varname[64];
    char name[64];
    int index = 0;

    get_GLSL_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    push_output(ctx, &ctx->globals);

    if (var == NULL)
    {
        get_GLSL_uniform_array_varname(ctx, regtype, name, sizeof (name));

        if (regtype == REG_TYPE_CONST)
            index = ctx->uniform_float4_count;
        else if (regtype == REG_TYPE_CONSTINT)
            index = ctx->uniform_int4_count;
        else if (regtype == REG_TYPE_CONSTBOOL)
            index = ctx->uniform_bool_count;
        else  // get_GLSL_uniform_array_varname() would have called fail().
            assert(isfail(ctx));

        output_line(ctx, "#define %s %s[%d]", varname, name, index);
    } // if

    else
    {
        const int arraybase = var->index;
        if (var->constant)
        {
            get_GLSL_const_array_varname_in_buf(ctx, arraybase, var->count,
                                                name, sizeof (name));
            index = (regnum - arraybase);
        } // if
        else
        {
            assert(var->emit_position != -1);
            get_GLSL_uniform_array_varname(ctx, regtype, name, sizeof (name));
            index = (regnum - arraybase) + var->emit_position;
        } // else

        output_line(ctx, "#define %s %s[%d]", varname, name, index);
    } // else

    pop_output(ctx);
}